

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.cpp
# Opt level: O0

LValue * __thiscall
slang::ast::MemberAccessExpression::evalLValueImpl
          (MemberAccessExpression *this,EvalContext *context)

{
  string_view arg;
  SourceRange range;
  SourceRange sourceRange;
  string_view memberName;
  bool bVar1;
  undefined1 uVar2;
  __optional_ne_t<unsigned_int,_unsigned_int> _Var3;
  bitwidth_t bVar4;
  FieldSymbol *pFVar5;
  SourceLocation SVar6;
  Diagnostic *pDVar7;
  ConstantRange range_00;
  MemberAccessExpression *in_RSI;
  LValue *in_RDI;
  int32_t width_1;
  int32_t io;
  int32_t width;
  ConstantValue cv;
  ConstantValue *target;
  Type *valueType;
  FieldSymbol *field;
  LValue lval;
  LValue *in_stack_fffffffffffffc88;
  EvalContext *in_stack_fffffffffffffc90;
  undefined4 in_stack_fffffffffffffc98;
  undefined4 in_stack_fffffffffffffc9c;
  ConstantRange in_stack_fffffffffffffca0;
  undefined4 in_stack_fffffffffffffca8;
  undefined4 in_stack_fffffffffffffcac;
  undefined4 in_stack_fffffffffffffcd0;
  undefined4 in_stack_fffffffffffffcd4;
  EvalContext *in_stack_fffffffffffffcd8;
  ConstantValue *in_stack_fffffffffffffce0;
  undefined4 in_stack_fffffffffffffce8;
  int32_t in_stack_fffffffffffffcec;
  EvalContext *in_stack_fffffffffffffcf0;
  undefined8 in_stack_fffffffffffffcf8;
  uint32_t expectedTag;
  SVInt *in_stack_fffffffffffffd00;
  undefined6 in_stack_fffffffffffffd08;
  undefined1 in_stack_fffffffffffffd0e;
  undefined4 in_stack_fffffffffffffd10;
  undefined4 in_stack_fffffffffffffd14;
  undefined4 uVar8;
  FieldSymbol *pFVar9;
  LValue *pLVar10;
  ConstantRange local_2a4;
  bitwidth_t local_29c;
  int local_298;
  ConstantRange local_294;
  bitwidth_t local_28c;
  LValue *local_288;
  EvalContext *pEStack_280;
  SourceLocation local_278;
  SourceLocation SStack_270;
  size_t local_218;
  char *pcStack_210;
  SourceLocation local_208;
  SourceLocation SStack_200;
  undefined4 local_1f4;
  ConstantValue *local_1f0;
  LValue *in_stack_fffffffffffffe38;
  
  expectedTag = (uint32_t)((ulong)in_stack_fffffffffffffcf8 >> 0x20);
  pLVar10 = in_RDI;
  value(in_RSI);
  Expression::evalLValue
            ((Expression *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
             in_stack_fffffffffffffc90);
  bVar1 = LValue::operator_cast_to_bool((LValue *)0xbeb174);
  if (bVar1) {
    pFVar5 = Symbol::as<slang::ast::FieldSymbol>((Symbol *)0xbeb1d7);
    pFVar9 = pFVar5;
    value(in_RSI);
    not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0xbeb219);
    SVar6 = (SourceLocation)Type::getCanonicalType((Type *)in_stack_fffffffffffffc90);
    bVar1 = Type::isUnpackedStruct((Type *)0xbeb257);
    uVar8 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffd14);
    if (bVar1) {
      slang::ConstantValue::ConstantValue
                ((ConstantValue *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
      LValue::addIndex((LValue *)in_stack_fffffffffffffcf0,in_stack_fffffffffffffcec,
                       in_stack_fffffffffffffce0);
      slang::ConstantValue::~ConstantValue((ConstantValue *)0xbeb2c0);
    }
    else {
      uVar2 = Type::isUnpackedUnion((Type *)0xbeb2f8);
      if ((bool)uVar2) {
        bVar1 = Type::isTaggedUnion((Type *)CONCAT44(in_stack_fffffffffffffc9c,
                                                     in_stack_fffffffffffffc98));
        if (bVar1) {
          local_1f0 = LValue::resolve((LValue *)
                                      CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8))
          ;
          slang::ConstantValue::unionVal((ConstantValue *)0xbeb369);
          in_stack_fffffffffffffcf0 =
               (EvalContext *)
               CopyPtr<slang::SVUnion>::operator->((CopyPtr<slang::SVUnion> *)0xbeb37a);
          _Var3 = std::operator!=((optional<unsigned_int> *)in_stack_fffffffffffffc90,
                                  (uint *)in_stack_fffffffffffffc88);
          in_stack_fffffffffffffcec = CONCAT13(_Var3,(int3)in_stack_fffffffffffffcec);
          if (_Var3) {
            local_1f4 = 0x1c000c;
            local_208 = (in_RSI->super_Expression).sourceRange.startLoc;
            SStack_200 = (in_RSI->super_Expression).sourceRange.endLoc;
            range.endLoc._0_4_ = in_stack_fffffffffffffce8;
            range.startLoc = (SourceLocation)in_stack_fffffffffffffce0;
            range.endLoc._4_4_ = in_stack_fffffffffffffcec;
            pDVar7 = EvalContext::addDiag
                               (in_stack_fffffffffffffcd8,
                                SUB84((ulong)in_stack_fffffffffffffcf0 >> 0x20,0),range);
            local_218 = (in_RSI->member->name)._M_len;
            pcStack_210 = (in_RSI->member->name)._M_str;
            arg._M_str = (char *)pDVar7;
            arg._M_len = (size_t)in_stack_fffffffffffffcd8;
            Diagnostic::operator<<
                      ((Diagnostic *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                       arg);
            LValue::LValue((LValue *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
            goto LAB_00beb739;
          }
        }
        not_null<const_slang::ast::Type_*>::operator->
                  ((not_null<const_slang::ast::Type_*> *)0xbeb477);
        Type::getDefaultValue((Type *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98))
        ;
        LValue::addIndex((LValue *)in_stack_fffffffffffffcf0,in_stack_fffffffffffffcec,
                         in_stack_fffffffffffffce0);
        slang::ConstantValue::~ConstantValue((ConstantValue *)0xbeb4ba);
      }
      else {
        bVar1 = Type::isPackedUnion((Type *)0xbeb4f2);
        if (bVar1) {
          LValue::load(in_stack_fffffffffffffe38);
          slang::ConstantValue::integer((ConstantValue *)0xbeb536);
          local_278 = (in_RSI->super_Expression).sourceRange.startLoc;
          SStack_270 = (in_RSI->super_Expression).sourceRange.endLoc;
          in_stack_fffffffffffffc88 = (LValue *)(in_RSI->member->name)._M_len;
          in_stack_fffffffffffffc90 = (EvalContext *)(in_RSI->member->name)._M_str;
          sourceRange.startLoc._4_4_ = uVar8;
          sourceRange.startLoc._0_4_ = in_stack_fffffffffffffd10;
          sourceRange.endLoc = SVar6;
          memberName._M_str = (char *)pLVar10;
          memberName._M_len = (size_t)pFVar9;
          local_288 = in_stack_fffffffffffffc88;
          pEStack_280 = in_stack_fffffffffffffc90;
          bVar1 = checkPackedUnionTag((Type *)CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffd0e,
                                                                      in_stack_fffffffffffffd08)),
                                      in_stack_fffffffffffffd00,expectedTag,
                                      in_stack_fffffffffffffcf0,sourceRange,memberName);
          if (bVar1) {
            not_null<const_slang::ast::Type_*>::operator->
                      ((not_null<const_slang::ast::Type_*> *)0xbeb60e);
            local_28c = Type::getBitWidth((Type *)CONCAT44(in_stack_fffffffffffffc9c,
                                                           in_stack_fffffffffffffc98));
            ConstantRange::ConstantRange(&local_294,local_28c - 1,0);
            LValue::addBitSlice((LValue *)
                                CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                                in_stack_fffffffffffffca0);
          }
          else {
            LValue::LValue((LValue *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
          }
          slang::ConstantValue::~ConstantValue((ConstantValue *)0xbeb679);
          if (!bVar1) goto LAB_00beb739;
        }
        else {
          local_298 = (int)pFVar5->bitOffset;
          range_00 = (ConstantRange)
                     not_null<const_slang::ast::Type_*>::operator->
                               ((not_null<const_slang::ast::Type_*> *)0xbeb6b5);
          bVar4 = Type::getBitWidth((Type *)CONCAT44(in_stack_fffffffffffffc9c,
                                                     in_stack_fffffffffffffc98));
          local_29c = bVar4;
          ConstantRange::ConstantRange(&local_2a4,(bVar4 - 1) + local_298,local_298);
          LValue::addBitSlice((LValue *)CONCAT44(bVar4,in_stack_fffffffffffffc98),range_00);
        }
      }
    }
    LValue::LValue((LValue *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
  }
  else {
    LValue::LValue((LValue *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
  }
LAB_00beb739:
  LValue::~LValue((LValue *)0xbeb746);
  return in_RDI;
}

Assistant:

LValue MemberAccessExpression::evalLValueImpl(EvalContext& context) const {
    LValue lval = value().evalLValue(context);
    if (!lval)
        return nullptr;

    auto& field = member.as<FieldSymbol>();
    auto& valueType = value().type->getCanonicalType();
    if (valueType.isUnpackedStruct()) {
        lval.addIndex((int32_t)field.fieldIndex, nullptr);
    }
    else if (valueType.isUnpackedUnion()) {
        if (valueType.isTaggedUnion()) {
            auto target = lval.resolve();
            SLANG_ASSERT(target);

            if (target->unionVal()->activeMember != field.fieldIndex) {
                context.addDiag(diag::ConstEvalTaggedUnion, sourceRange) << member.name;
                return nullptr;
            }
        }
        lval.addIndex((int32_t)field.fieldIndex, type->getDefaultValue());
    }
    else if (valueType.isPackedUnion()) {
        auto cv = lval.load();
        if (!checkPackedUnionTag(valueType, cv.integer(), field.fieldIndex, context, sourceRange,
                                 member.name)) {
            return nullptr;
        }

        int32_t width = (int32_t)type->getBitWidth();
        lval.addBitSlice({width - 1, 0});
    }
    else {
        int32_t io = (int32_t)field.bitOffset;
        int32_t width = (int32_t)type->getBitWidth();
        lval.addBitSlice({width + io - 1, io});
    }

    return lval;
}